

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O1

UniquePtr<SSLAEADContext>
bssl::SSLAEADContext::Create
          (evp_aead_direction_t direction,uint16_t version,SSL_CIPHER *cipher,
          Span<const_unsigned_char> enc_key,Span<const_unsigned_char> mac_key,
          Span<const_unsigned_char> fixed_iv)

{
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined6 in_register_00000032;
  undefined4 in_register_0000003c;
  tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter> tVar5;
  size_t in_R9;
  uint16_t protocol_version;
  size_t expected_fixed_iv_len;
  size_t expected_mac_key_len;
  uint8_t merged_key [80];
  uint16_t local_c2;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_c0;
  EVP_AEAD *local_b8;
  SSL_CIPHER *local_b0;
  ulong local_a8;
  SSLAEADContext *local_a0;
  size_t local_98;
  size_t local_90;
  undefined1 local_88 [88];
  
  tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl._0_4_ = direction;
  local_b0 = (SSL_CIPHER *)enc_key.data_;
  bVar2 = ssl_protocol_version_from_wire(&local_c2,(uint16_t)cipher);
  if ((((!bVar2) ||
       (bVar2 = ssl_cipher_get_evp_aead(&local_b8,&local_90,&local_98,local_b0,local_c2), !bVar2))
      || (local_98 != fixed_iv.size_)) || (local_90 != mac_key.size_)) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                  ,0x3a);
    *(undefined8 *)
     tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = 0;
    return (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
           (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
           tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
  }
  local_c0._M_head_impl = New<bssl::SSLAEADContext,ssl_cipher_st_const*&>(&local_b0);
  if (local_c0._M_head_impl != (SSLAEADContext *)0x0) {
    sVar4 = EVP_AEAD_nonce_length(local_b8);
    if (0x20 < sVar4) {
      __assert_fail("EVP_AEAD_nonce_length(aead) <= EVP_AEAD_MAX_NONCE_LENGTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                    ,0x44,
                    "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                   );
    }
    sVar4 = EVP_AEAD_nonce_length(local_b8);
    _Var1._M_head_impl = local_c0._M_head_impl;
    (local_c0._M_head_impl)->variable_nonce_len_ = (uint8_t)sVar4;
    if (mac_key.size_ != 0) {
      if (0x303 < local_c2) {
        __assert_fail("protocol_version < TLS1_3_VERSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,99,
                      "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                     );
      }
      local_a0 = local_c0._M_head_impl;
      local_a8 = fixed_iv.size_ + in_R9 + mac_key.size_;
      if (local_a8 < 0x51) {
        memcpy(local_88,mac_key.data_,mac_key.size_);
      }
LAB_0014c023:
      abort();
    }
    if (0x20 < fixed_iv.size_) goto LAB_0014c023;
    ((local_c0._M_head_impl)->fixed_nonce_).size_ = '\0';
    if (fixed_iv.size_ != 0) {
      memmove(&(local_c0._M_head_impl)->fixed_nonce_,fixed_iv.data_,fixed_iv.size_);
    }
    ((_Var1._M_head_impl)->fixed_nonce_).size_ = (PackedSize<32UL>)fixed_iv.size_;
    if ((local_c2 < 0x304) && ((local_b0->algorithm_enc & 0x20) == 0)) {
      if ((_Var1._M_head_impl)->variable_nonce_len_ < fixed_iv.size_) {
        __assert_fail("fixed_iv.size() <= aead_ctx->variable_nonce_len_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x55,
                      "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                     );
      }
      if ((local_b0->algorithm_enc & 0x18) == 0) {
        __assert_fail("cipher->algorithm_enc & (SSL_AES128GCM | SSL_AES256GCM)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x56,
                      "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                     );
      }
      (_Var1._M_head_impl)->variable_nonce_len_ =
           (_Var1._M_head_impl)->variable_nonce_len_ - (PackedSize<32UL>)fixed_iv.size_;
      (_Var1._M_head_impl)->field_0x26a = (_Var1._M_head_impl)->field_0x26a | 1;
    }
    else {
      (_Var1._M_head_impl)->field_0x26a = (_Var1._M_head_impl)->field_0x26a | 4;
      (_Var1._M_head_impl)->variable_nonce_len_ = '\b';
      if (fixed_iv.size_ < 8) {
        __assert_fail("fixed_iv.size() >= aead_ctx->variable_nonce_len_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x52,
                      "static UniquePtr<SSLAEADContext> bssl::SSLAEADContext::Create(enum evp_aead_direction_t, uint16_t, const SSL_CIPHER *, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>)"
                     );
      }
    }
    if (0x303 < local_c2) {
      (_Var1._M_head_impl)->field_0x26a = (_Var1._M_head_impl)->field_0x26a | 0x10;
    }
    iVar3 = EVP_AEAD_CTX_init_with_direction
                      (&((_Var1._M_head_impl)->ctx_).ctx_,local_b8,(uint8_t *)enc_key.size_,in_R9,0,
                       (evp_aead_direction_t)CONCAT62(in_register_00000032,version));
    if (iVar3 != 0) {
      *(SSLAEADContext **)
       tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = local_c0._M_head_impl;
      local_c0._M_head_impl = (SSLAEADContext *)0x0;
      goto LAB_0014bff5;
    }
  }
  *(undefined8 *)
   tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = 0;
LAB_0014bff5:
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_c0);
  return (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
         (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
         tVar5.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
}

Assistant:

UniquePtr<SSLAEADContext> SSLAEADContext::Create(
    enum evp_aead_direction_t direction, uint16_t version,
    const SSL_CIPHER *cipher, Span<const uint8_t> enc_key,
    Span<const uint8_t> mac_key, Span<const uint8_t> fixed_iv) {
  const EVP_AEAD *aead;
  uint16_t protocol_version;
  size_t expected_mac_key_len, expected_fixed_iv_len;
  if (!ssl_protocol_version_from_wire(&protocol_version, version) ||
      !ssl_cipher_get_evp_aead(&aead, &expected_mac_key_len,
                               &expected_fixed_iv_len, cipher,
                               protocol_version) ||
      // Ensure the caller returned correct key sizes.
      expected_fixed_iv_len != fixed_iv.size() ||
      expected_mac_key_len != mac_key.size()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return nullptr;
  }

  UniquePtr<SSLAEADContext> aead_ctx = MakeUnique<SSLAEADContext>(cipher);
  if (!aead_ctx) {
    return nullptr;
  }

  uint8_t merged_key[EVP_AEAD_MAX_KEY_LENGTH];
  assert(EVP_AEAD_nonce_length(aead) <= EVP_AEAD_MAX_NONCE_LENGTH);
  static_assert(EVP_AEAD_MAX_NONCE_LENGTH < 256,
                "variable_nonce_len doesn't fit in uint8_t");
  aead_ctx->variable_nonce_len_ = (uint8_t)EVP_AEAD_nonce_length(aead);
  if (mac_key.empty()) {
    // This is an actual AEAD.
    aead_ctx->fixed_nonce_.CopyFrom(fixed_iv);

    if (protocol_version >= TLS1_3_VERSION ||
        cipher->algorithm_enc & SSL_CHACHA20POLY1305) {
      // TLS 1.3, and TLS 1.2 ChaCha20-Poly1305, XOR the fixed IV with the
      // sequence number to form the nonce.
      aead_ctx->xor_fixed_nonce_ = true;
      aead_ctx->variable_nonce_len_ = 8;
      assert(fixed_iv.size() >= aead_ctx->variable_nonce_len_);
    } else {
      // TLS 1.2 AES-GCM prepends the fixed IV to an explicit nonce.
      assert(fixed_iv.size() <= aead_ctx->variable_nonce_len_);
      assert(cipher->algorithm_enc & (SSL_AES128GCM | SSL_AES256GCM));
      aead_ctx->variable_nonce_len_ -= fixed_iv.size();
      aead_ctx->variable_nonce_included_in_record_ = true;
    }

    // Starting TLS 1.3, the AAD is the whole record header.
    if (protocol_version >= TLS1_3_VERSION) {
      aead_ctx->ad_is_header_ = true;
    }
  } else {
    // This is a CBC cipher suite that implements the |EVP_AEAD| interface. The
    // |EVP_AEAD| takes the MAC key, encryption key, and fixed IV concatenated
    // as its input key.
    assert(protocol_version < TLS1_3_VERSION);
    BSSL_CHECK(mac_key.size() + enc_key.size() + fixed_iv.size() <=
               sizeof(merged_key));
    OPENSSL_memcpy(merged_key, mac_key.data(), mac_key.size());
    OPENSSL_memcpy(merged_key + mac_key.size(), enc_key.data(), enc_key.size());
    OPENSSL_memcpy(merged_key + mac_key.size() + enc_key.size(),
                   fixed_iv.data(), fixed_iv.size());
    enc_key =
        Span(merged_key, enc_key.size() + mac_key.size() + fixed_iv.size());

    // The |EVP_AEAD|'s per-encryption nonce, if any, is actually the CBC IV. It
    // must be generated randomly and prepended to the record.
    aead_ctx->variable_nonce_included_in_record_ = true;
    aead_ctx->random_variable_nonce_ = true;
    aead_ctx->omit_length_in_ad_ = true;
  }

  if (!EVP_AEAD_CTX_init_with_direction(
          aead_ctx->ctx_.get(), aead, enc_key.data(), enc_key.size(),
          EVP_AEAD_DEFAULT_TAG_LENGTH, direction)) {
    return nullptr;
  }

  return aead_ctx;
}